

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

void TTD::NSSnapObjects::StdPropertyExtract_DynamicType
               (SnapObject *snpObject,DynamicObject *dynObj,SlabAllocator *alloc)

{
  SnapType *pSVar1;
  SnapHandler *pSVar2;
  int iVar3;
  uint uVar4;
  void **dst;
  Type *src;
  Var *src_00;
  ArrayObject *pAVar5;
  size_t sizeInBytes;
  
  pSVar1 = snpObject->SnapType;
  iVar3 = (*(dynObj->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x66])(dynObj);
  snpObject->IsCrossSite = iVar3;
  pSVar2 = pSVar1->TypeHandlerInfo;
  uVar4 = pSVar2->MaxPropertyIndex;
  if ((ulong)uVar4 == 0) {
    snpObject->VarArrayCount = 0;
    snpObject->VarArray = (TTDVar *)0x0;
  }
  else {
    snpObject->VarArrayCount = uVar4;
    dst = SlabAllocatorBase<0>::SlabAllocateArray<void*>(alloc,(ulong)uVar4);
    snpObject->VarArray = dst;
    if (pSVar2->InlineSlotCapacity == 0) {
      uVar4 = 0;
    }
    else {
      src = Js::DynamicObject::GetInlineSlots_TTD(dynObj);
      uVar4 = pSVar2->InlineSlotCapacity;
      if (pSVar2->MaxPropertyIndex < pSVar2->InlineSlotCapacity) {
        uVar4 = pSVar2->MaxPropertyIndex;
      }
      js_memcpy_s(dst,(ulong)uVar4 << 3,src,(ulong)uVar4 << 3);
      uVar4 = pSVar2->InlineSlotCapacity;
    }
    if (uVar4 < pSVar2->MaxPropertyIndex) {
      src_00 = Js::DynamicObject::GetAuxSlots_TTD(dynObj);
      sizeInBytes = (ulong)(pSVar2->MaxPropertyIndex - pSVar2->InlineSlotCapacity) << 3;
      js_memcpy_s(dst + uVar4,sizeInBytes,src_00,sizeInBytes);
    }
  }
  pAVar5 = Js::DynamicObject::GetObjectArray(dynObj);
  snpObject->OptIndexedObjectArray = (TTD_PTR_ID)pAVar5;
  snpObject->OptDependsOnInfo = (DependsOnInfo *)0x0;
  return;
}

Assistant:

void StdPropertyExtract_DynamicType(SnapObject* snpObject, Js::DynamicObject* dynObj, SlabAllocator& alloc)
        {
            NSSnapType::SnapType* sType = snpObject->SnapType;

            snpObject->IsCrossSite = dynObj->IsCrossSiteObject();

#if ENABLE_OBJECT_SOURCE_TRACKING
            CopyDiagnosticOriginInformation(snpObject->DiagOriginInfo, dynObj->TTDDiagOriginInfo);
#endif

            if(sType->TypeHandlerInfo->MaxPropertyIndex == 0)
            {
                snpObject->VarArrayCount = 0;
                snpObject->VarArray = nullptr;
            }
            else
            {
                NSSnapType::SnapHandler* sHandler = sType->TypeHandlerInfo;

                static_assert(sizeof(TTDVar) == sizeof(Js::Var), "These need to be the same size (and have same bit layout) for this to work!");

                snpObject->VarArrayCount = sHandler->MaxPropertyIndex;
                snpObject->VarArray = alloc.SlabAllocateArray<TTDVar>(snpObject->VarArrayCount);

                TTDVar* cpyBase = snpObject->VarArray;
                if(sHandler->InlineSlotCapacity != 0)
                {
                    Field(Js::Var) const* inlineSlots = dynObj->GetInlineSlots_TTD();

                    //copy all the properties (if they all fit into the inline slots) otherwise just copy all the inline slot values
                    uint32 inlineSlotCount = min(sHandler->MaxPropertyIndex, sHandler->InlineSlotCapacity);
                    js_memcpy_s(cpyBase, inlineSlotCount * sizeof(TTDVar), inlineSlots, inlineSlotCount * sizeof(Js::Var));
                }

                if(sHandler->MaxPropertyIndex > sHandler->InlineSlotCapacity)
                {
                    cpyBase = cpyBase + sHandler->InlineSlotCapacity;
                    Js::Var const* auxSlots = dynObj->GetAuxSlots_TTD();

                    //there are some values in aux slots (in addition to the inline slots) so copy them as well
                    uint32 auxSlotCount = (sHandler->MaxPropertyIndex - sHandler->InlineSlotCapacity);
                    js_memcpy_s(cpyBase, auxSlotCount * sizeof(TTDVar), auxSlots, auxSlotCount * sizeof(Js::Var));
                }
            }

            Js::ArrayObject* parray = dynObj->GetObjectArray();
            snpObject->OptIndexedObjectArray = (parray == nullptr) ? TTD_INVALID_PTR_ID : TTD_CONVERT_VAR_TO_PTR_ID(parray);

            snpObject->OptDependsOnInfo = nullptr;
            //AddtlSnapObjectInfo must be set later in type specific extract code
        }